

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O2

unsigned_long pg::pm_val(int *pm,int k,int pl)

{
  unsigned_long uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  for (uVar2 = 0; (uint)(~(k >> 0x1f) & k) != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = (ulong)((pm[uVar2] & 1U) == pl && pm[uVar2] != 0xffffffff) + uVar1 * 2;
  }
  return uVar1;
}

Assistant:

static unsigned long
pm_val(int* pm, int k, int pl)
{
    unsigned long res=0;
    for (int i=0; i<k; i++) {
        res <<= 1;
        if (pm[i] != -1 and (pm[i]&1)==pl) res++;
    }
    return res;
}